

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O3

void doubleCos1D_train<IMLE>(IMLE *imleObj,int nTrain)

{
  double *__ptr;
  ostream *poVar1;
  undefined8 *puVar2;
  result_type_conflict rVar3;
  double dVar4;
  undefined8 extraout_XMM0_Qb;
  uniform_01<double,_double> uniform;
  unit_normal_distribution<double> impl;
  mt19937 rng;
  new_uniform_01<double> local_a32;
  unit_normal_distribution<double> local_a31;
  double local_a30;
  X local_a28;
  Z local_a18;
  double local_a08;
  undefined8 uStack_a00;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)malloc(8);
  if (local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      (double *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = operator_delete;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
  __ptr = (double *)malloc(8);
  if (__ptr == (double *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = operator_delete;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = __ptr;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t --- Training, y = {cos(x), cos(x)+4}, ",0x28);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,nTrain);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," training points ---",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (0 < nTrain) {
    local_a08 = 0.0;
    uStack_a00 = 0;
    do {
      rVar3 = boost::random::detail::new_uniform_01<double>::operator()(&local_a32,&local_9f8);
      local_a08 = rVar3 * 0.02 + local_a08;
      uStack_a00 = extraout_XMM0_Qb;
      if (local_a08 <= 0.0) {
        *local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             local_a08 + 12.566370614359172;
        local_a30 = cos(local_a08 + 12.566370614359172);
        dVar4 = boost::random::detail::unit_normal_distribution<double>::operator()
                          (&local_a31,&local_9f8);
        dVar4 = (dVar4 + 0.0) * 0.1 + local_a30 + 4.0;
      }
      else {
        *local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             local_a08;
        local_a30 = cos(local_a08);
        dVar4 = boost::random::detail::unit_normal_distribution<double>::operator()
                          (&local_a31,&local_9f8);
        dVar4 = (dVar4 + 0.0) * 0.1 + local_a30;
      }
      *local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           dVar4;
      IMLE::update(imleObj,&local_a18,&local_a28);
      local_a08 = (double)(~-(ulong)(12.566370614359172 < local_a08) & (ulong)(local_a08 + 0.1) |
                          -(ulong)(12.566370614359172 < local_a08) & 0xc02921fb54442d18);
      nTrain = nTrain + -1;
      __ptr = local_a28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    } while (nTrain != 0);
  }
  free(__ptr);
  free(local_a18.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void doubleCos1D_train( Learner &imleObj, int nTrain = 2000)
{
    // Noise model
    const Scal NOISE_Z = 0.02;
    const Scal NOISE_X = 0.1;
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    boost::normal_distribution<Scal> normal;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Training
	cout << "\t --- Training, y = {cos(x), cos(x)+4}, " << nTrain << " training points ---" << endl;
	Scal zTrain = 0.0;
    for(int k = 0; k < nTrain; k++)
    {
        zTrain += uniform(rng) * NOISE_Z;

        if( zTrain > 0.0 )      // Lower branch
        {
            z[0] = zTrain;
            x[0] = cos(z[0]) + NOISE_X * normal(rng);
        }
        else                   // Upper branch
        {
            z[0] = zTrain + 4*M_PI;
            x[0] = cos(z[0]) + 4.0 + NOISE_X * normal(rng);
        }

        imleObj.update(z,x);

		if( zTrain > 4*M_PI )
            zTrain = -4*M_PI;
        else
            zTrain += 0.1;
    }
}